

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar5.c
# Opt level: O0

wchar_t is_valid_filter_block_start(rar5 *rar,uint32_t start)

{
  long lVar1;
  long lVar2;
  ssize_t last_bl;
  int64_t last_bs;
  int64_t block_start;
  uint32_t start_local;
  rar5 *rar_local;
  
  lVar1 = (rar->cstate).last_block_start;
  lVar2 = (rar->cstate).last_block_length;
  if ((lVar1 == 0) || (lVar2 == 0)) {
    rar_local._4_4_ = L'\x01';
  }
  else if ((long)((ulong)start + (rar->cstate).write_ptr) < lVar1 + lVar2) {
    rar_local._4_4_ = L'\0';
  }
  else {
    rar_local._4_4_ = L'\x01';
  }
  return rar_local._4_4_;
}

Assistant:

static int is_valid_filter_block_start(struct rar5* rar,
    uint32_t start)
{
	const int64_t block_start = (ssize_t) start + rar->cstate.write_ptr;
	const int64_t last_bs = rar->cstate.last_block_start;
	const ssize_t last_bl = rar->cstate.last_block_length;

	if(last_bs == 0 || last_bl == 0) {
		/* We didn't have any filters yet, so accept this offset. */
		return 1;
	}

	if(block_start >= last_bs + last_bl) {
		/* Current offset is bigger than last block's end offset, so
		 * accept current offset. */
		return 1;
	}

	/* Any other case is not a normal situation and we should fail. */
	return 0;
}